

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * monty_sub(MontyContext *mc,mp_int *x,mp_int *y)

{
  mp_int *b;
  uint uVar1;
  mp_int *a;
  
  b = mc->m;
  a = mp_make_sized(b->nw);
  mp_add_masked_into(a->w,a->nw,x,y,0xffffffffffffffff,0xffffffffffffffff,1);
  uVar1 = mp_cmp_hs(x,y);
  mp_add_masked_into(a->w,a->nw,a,b,-(ulong)(uVar1 ^ 1),0,0);
  return a;
}

Assistant:

mp_int *monty_sub(MontyContext *mc, mp_int *x, mp_int *y)
{
    return mp_modsub_in_range(x, y, mc->m);
}